

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O0

EVENT_TYPE validate_pc_signature(char *str_code)

{
  int iVar1;
  uint local_44;
  int local_40;
  int j;
  int i;
  uint calc_identifiers_size;
  PcIdentifier *calculated_identifiers;
  IDENTIFICATION_STRATEGY current_strategy_id;
  IDENTIFICATION_STRATEGY previous_strategy_id;
  FUNCTION_RETURN result;
  PcIdentifier user_identifiers [2];
  char *str_code_local;
  
  _i = (PcIdentifier *)0x0;
  j = 0;
  user_identifiers._4_8_ = str_code;
  str_code_local._4_4_ =
       decode_pc_id((uchar *)&previous_strategy_id,(byte *)((long)&result + 2),str_code);
  if (str_code_local._4_4_ == FUNC_RET_OK) {
    calculated_identifiers._4_4_ = STRATEGY_UNKNOWN;
    current_strategy_id = DEFAULT;
    for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
      calculated_identifiers._0_4_ =
           strategy_from_pc_id((uchar *)((long)&previous_strategy_id + (long)local_40 * 6));
      if ((IDENTIFICATION_STRATEGY)calculated_identifiers == STRATEGY_UNKNOWN) {
        free(_i);
        return LICENSE_MALFORMED;
      }
      if ((IDENTIFICATION_STRATEGY)calculated_identifiers != calculated_identifiers._4_4_) {
        if (_i != (PcIdentifier *)0x0) {
          free(_i);
        }
        calculated_identifiers._4_4_ = (IDENTIFICATION_STRATEGY)calculated_identifiers;
        generate_pc_id((PcIdentifier *)0x0,(uint *)&j,
                       (IDENTIFICATION_STRATEGY)calculated_identifiers);
        _i = (PcIdentifier *)malloc((ulong)(uint)j * 6);
        memset(_i,0,(ulong)(uint)j * 6);
        generate_pc_id(_i,(uint *)&j,(IDENTIFICATION_STRATEGY)calculated_identifiers);
      }
      for (local_44 = 0; local_44 < (uint)j; local_44 = local_44 + 1) {
        iVar1 = memcmp((void *)((long)&previous_strategy_id + (long)local_40 * 6),_i + (int)local_44
                       ,6);
        if (iVar1 == 0) {
          free(_i);
          return LICENSE_OK;
        }
      }
    }
    free(_i);
    str_code_local._4_4_ = 9;
  }
  return str_code_local._4_4_;
}

Assistant:

EVENT_TYPE validate_pc_signature(PcSignature str_code) {
	PcIdentifier user_identifiers[2];
	FUNCTION_RETURN result;
	IDENTIFICATION_STRATEGY previous_strategy_id, current_strategy_id;
	PcIdentifier* calculated_identifiers = NULL;
	unsigned int calc_identifiers_size = 0;
	int i = 0, j = 0;
	//bool found;
#ifdef _DEBUG
	printf("Comparing pc identifiers: \n");
#endif
	result = decode_pc_id(user_identifiers[0], user_identifiers[1], str_code);
	if (result != FUNC_RET_OK) {
		return result;
	}
	previous_strategy_id = STRATEGY_UNKNOWN;
	//found = false;
	for (i = 0; i < 2; i++) {
		current_strategy_id = strategy_from_pc_id(user_identifiers[i]);
		if (current_strategy_id == STRATEGY_UNKNOWN) {
			free(calculated_identifiers);
			return LICENSE_MALFORMED;
		}
		if (current_strategy_id != previous_strategy_id) {
			if (calculated_identifiers != NULL) {
				free(calculated_identifiers);
			}
			previous_strategy_id = current_strategy_id;
			generate_pc_id(NULL, &calc_identifiers_size, current_strategy_id);
			calculated_identifiers = (PcIdentifier *) malloc(
					sizeof(PcIdentifier) * calc_identifiers_size);
			memset(calculated_identifiers, 0, sizeof(PcIdentifier) * calc_identifiers_size);
			generate_pc_id(calculated_identifiers, &calc_identifiers_size,
					current_strategy_id);
		}
		//maybe skip the byte 0
		for (j = 0; j < calc_identifiers_size; j++) {
#ifdef _DEBUG
			printf("generated id: %02x%02x%02x%02x%02x%02x index %d, user_supplied id %02x%02x%02x%02x%02x%02x idx: %d\n",
					calculated_identifiers[j][0], calculated_identifiers[j][1], calculated_identifiers[j][2],
					calculated_identifiers[j][3], calculated_identifiers[j][4], calculated_identifiers[j][5], j,
					user_identifiers[i][0], user_identifiers[i][1], user_identifiers[i][2], user_identifiers[i][3], user_identifiers[i][4], user_identifiers[i][5], i);

#endif
			if (!memcmp(user_identifiers[i], calculated_identifiers[j],
					sizeof(PcIdentifier))) {
				free(calculated_identifiers);
				return LICENSE_OK;
			}
		}
	}
	free(calculated_identifiers);
	return IDENTIFIERS_MISMATCH;
}